

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

void Curl_cookie_clearsess(CookieInfo *cookies)

{
  Cookie *pCVar1;
  Cookie *pCVar2;
  Cookie *local_30;
  Cookie *prev;
  Cookie *next;
  Cookie *curr;
  Cookie *first;
  CookieInfo *cookies_local;
  
  if ((cookies != (CookieInfo *)0x0) && (cookies->cookies != (Cookie *)0x0)) {
    local_30 = cookies->cookies;
    next = local_30;
    curr = local_30;
    while (next != (Cookie *)0x0) {
      pCVar1 = next->next;
      if (next->expires == 0) {
        if (curr == next) {
          curr = pCVar1;
        }
        pCVar2 = pCVar1;
        if (local_30 != next) {
          local_30->next = pCVar1;
          pCVar2 = local_30;
        }
        local_30 = pCVar2;
        freecookie(next);
        cookies->numcookies = cookies->numcookies + -1;
        next = pCVar1;
      }
      else {
        local_30 = next;
        next = pCVar1;
      }
    }
    cookies->cookies = curr;
  }
  return;
}

Assistant:

void Curl_cookie_clearsess(struct CookieInfo *cookies)
{
  struct Cookie *first, *curr, *next, *prev = NULL;

  if(!cookies || !cookies->cookies)
    return;

  first = curr = prev = cookies->cookies;

  for(; curr; curr = next) {
    next = curr->next;
    if(!curr->expires) {
      if(first == curr)
        first = next;

      if(prev == curr)
        prev = next;
      else
        prev->next = next;

      freecookie(curr);
      cookies->numcookies--;
    }
    else
      prev = curr;
  }

  cookies->cookies = first;
}